

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_autolink_email(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end)

{
  uint uVar1;
  char *pcVar2;
  int *in_RCX;
  uint in_EDX;
  int in_ESI;
  long *in_RDI;
  bool bVar3;
  int label_len;
  MD_OFFSET off;
  int local_28;
  uint local_24;
  
  local_24 = in_ESI + 1;
  while( true ) {
    bVar3 = false;
    if ((((local_24 < in_EDX) &&
         ((*(byte *)(*in_RDI + (ulong)local_24) < 0x41 ||
          (bVar3 = true, 0x5a < *(byte *)(*in_RDI + (ulong)local_24))))) &&
        ((*(byte *)(*in_RDI + (ulong)local_24) < 0x61 ||
         (bVar3 = true, 0x7a < *(byte *)(*in_RDI + (ulong)local_24))))) &&
       (((*(byte *)(*in_RDI + (ulong)local_24) < 0x30 ||
         (bVar3 = true, 0x39 < *(byte *)(*in_RDI + (ulong)local_24))) &&
        (bVar3 = false, *(char *)(*in_RDI + (ulong)local_24) != '\0')))) {
      pcVar2 = strchr(".!#$%&\'*+/=?^_`{|}~-",(int)*(char *)(*in_RDI + (ulong)local_24));
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (!bVar3) break;
    local_24 = local_24 + 1;
  }
  if (((in_ESI + 1U < local_24) && (local_24 < in_EDX)) &&
     (*(char *)(*in_RDI + (ulong)local_24) == '@')) {
    local_28 = 0;
    uVar1 = local_24;
    do {
      local_24 = uVar1 + 1;
      if (in_EDX <= local_24) {
LAB_00a144f2:
        if ((0 < local_28) &&
           (((local_24 < in_EDX && (*(char *)(*in_RDI + (ulong)local_24) == '>')) &&
            (*(char *)(*in_RDI + (ulong)uVar1) != '-')))) {
          *in_RCX = uVar1 + 2;
          return 1;
        }
        return 0;
      }
      if (((*(byte *)(*in_RDI + (ulong)local_24) < 0x41) ||
          (0x5a < *(byte *)(*in_RDI + (ulong)local_24))) &&
         (((*(byte *)(*in_RDI + (ulong)local_24) < 0x61 ||
           (0x7a < *(byte *)(*in_RDI + (ulong)local_24))) &&
          ((*(byte *)(*in_RDI + (ulong)local_24) < 0x30 ||
           (0x39 < *(byte *)(*in_RDI + (ulong)local_24))))))) {
        if ((*(char *)(*in_RDI + (ulong)local_24) == '-') && (0 < local_28)) {
          local_28 = local_28 + 1;
        }
        else {
          if ((*(char *)(*in_RDI + (ulong)local_24) != '.') ||
             ((local_28 < 1 || (*(char *)(*in_RDI + (ulong)uVar1) == '-')))) goto LAB_00a144f2;
          local_28 = 0;
        }
      }
      else {
        local_28 = local_28 + 1;
      }
      uVar1 = local_24;
    } while (local_28 < 0x40);
  }
  return 0;
}

Assistant:

static int
md_is_autolink_email(MD_CTX* ctx, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg + 1;
    int label_len;

    MD_ASSERT(CH(beg) == _T('<'));

    /* The code should correspond to this regexp:
            /^[a-zA-Z0-9.!#$%&'*+\/=?^_`{|}~-]+
            @[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?
            (?:\.[a-zA-Z0-9](?:[a-zA-Z0-9-]{0,61}[a-zA-Z0-9])?)*$/
     */

    /* Username (before '@'). */
    while(off < max_end  &&  (ISALNUM(off) || ISANYOF(off, _T(".!#$%&'*+/=?^_`{|}~-"))))
        off++;
    if(off <= beg+1)
        return FALSE;

    /* '@' */
    if(off >= max_end  ||  CH(off) != _T('@'))
        return FALSE;
    off++;

    /* Labels delimited with '.'; each label is sequence of 1 - 63 alnum
     * characters or '-', but '-' is not allowed as first or last char. */
    label_len = 0;
    while(off < max_end) {
        if(ISALNUM(off))
            label_len++;
        else if(CH(off) == _T('-')  &&  label_len > 0)
            label_len++;
        else if(CH(off) == _T('.')  &&  label_len > 0  &&  CH(off-1) != _T('-'))
            label_len = 0;
        else
            break;

        if(label_len > 63)
            return FALSE;

        off++;
    }

    if(label_len <= 0  || off >= max_end  ||  CH(off) != _T('>') ||  CH(off-1) == _T('-'))
        return FALSE;

    *p_end = off+1;
    return TRUE;
}